

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenBreak(BinaryenModuleRef module,char *name,BinaryenExpressionRef condition,
             BinaryenExpressionRef value)

{
  Break *pBVar1;
  string_view local_40;
  Builder local_30;
  
  local_30.wasm = module;
  wasm::Name::Name((Name *)&local_40,name);
  pBVar1 = wasm::Builder::makeBreak(&local_30,(Name)local_40,value,condition);
  return (BinaryenExpressionRef)pBVar1;
}

Assistant:

BinaryenExpressionRef BinaryenBreak(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenExpressionRef condition,
                                    BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBreak(name, (Expression*)value, (Expression*)condition));
}